

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

bool __thiscall cmCTestGIT::LoadRevisions(cmCTestGIT *this)

{
  pointer pcVar1;
  pointer pcVar2;
  long *plVar3;
  ostream *poVar4;
  cmUVProcessChainBuilder *pcVar5;
  long *plVar6;
  long lVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string git;
  string range;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_diff_tree;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_rev_list;
  cmUVProcessChainBuilder builder;
  CommitParser out;
  OutputLogger err;
  long *local_310;
  long local_308;
  long local_300 [2];
  long *local_2f0;
  long local_2e8;
  long local_2e0;
  long lStack_2d8;
  string local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  undefined1 local_280 [24];
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  local_268;
  _Alloc_hider local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240 [2];
  undefined1 local_220 [32];
  char *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 local_1e0 [32];
  _Alloc_hider *local_1c0 [2];
  _Alloc_hider local_1b0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  long local_190;
  undefined1 local_188 [8];
  undefined1 *local_180;
  undefined1 local_170 [16];
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  long *local_140 [2];
  long local_130 [21];
  vector<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_> local_88;
  OutputLogger local_70;
  
  pcVar2 = local_220 + 0x10;
  pcVar1 = (this->super_cmCTestGlobalVC).OldRevision._M_dataplus._M_p;
  local_220._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_220,pcVar1,
             pcVar1 + (this->super_cmCTestGlobalVC).OldRevision._M_string_length);
  std::__cxx11::string::append((char *)local_220);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             (local_220,
                              (ulong)(this->super_cmCTestGlobalVC).NewRevision._M_dataplus._M_p);
  local_2f0 = &local_2e0;
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_2e0 = *plVar6;
    lStack_2d8 = plVar3[3];
  }
  else {
    local_2e0 = *plVar6;
    local_2f0 = (long *)*plVar3;
  }
  local_2e8 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((pointer)local_220._0_8_ != pcVar2) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  local_310 = local_300;
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,pcVar1,
             pcVar1 + (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_string_length
            );
  local_220._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_220,local_310,local_308 + (long)local_310);
  local_200 = local_1f8._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"rev-list","");
  local_1e0._0_8_ = (pointer)(local_1e0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"--reverse","");
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c0,local_2f0,local_2e8 + (long)local_2f0);
  plVar3 = &local_190;
  local_1a0._M_allocated_capacity = (size_type)plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"--","");
  __l._M_len = 5;
  __l._M_array = (iterator)local_220;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_298,__l,(allocator_type *)local_280);
  lVar7 = -0xa0;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  local_220._0_8_ = local_220 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_220,local_310,local_308 + (long)local_310);
  local_200 = local_1f8._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"diff-tree","");
  local_1e0._0_8_ = (pointer)(local_1e0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"--stdin","");
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"--always","");
  local_1a0._M_allocated_capacity = (size_type)&local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"-z","");
  local_180 = local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"-r","");
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"--pretty=raw","");
  plVar3 = local_130;
  local_140[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"--encoding=utf-8","");
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)local_220;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2b0,__l_00,(allocator_type *)local_280);
  lVar7 = -0x100;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  poVar4 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
  cmCTestVC::ComputeCommandLine((string *)local_220,&local_298);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)local_220._0_8_,local_220._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," | ",3);
  cmCTestVC::ComputeCommandLine((string *)local_280,&local_2b0);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)local_280._0_8_,local_280._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if (local_280._0_8_ != (long)local_280 + 0x10) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
  }
  if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_280);
  pcVar5 = cmUVProcessChainBuilder::AddCommand((cmUVProcessChainBuilder *)local_280,&local_298);
  pcVar5 = cmUVProcessChainBuilder::AddCommand(pcVar5,&local_2b0);
  pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_dataplus._M_p;
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,pcVar2,
             pcVar2 + (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_string_length
            );
  cmUVProcessChainBuilder::SetWorkingDirectory(pcVar5,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  CommitParser::CommitParser((CommitParser *)local_220,this,"dt-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_70,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"dt-err> ");
  cmProcessTools::RunProcess
            (&local_88,(cmUVProcessChainBuilder *)local_280,(OutputParser *)local_220,
             (OutputParser *)&local_70,UTF8);
  if (local_88.
      super__Vector_base<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (**(code **)(local_220._0_8_ + 0x10))(local_220,"",1);
  local_70.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00b21468;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.super_LineParser.Line._M_dataplus._M_p != &local_70.super_LineParser.Line.field_2)
  {
    operator_delete(local_70.super_LineParser.Line._M_dataplus._M_p,
                    local_70.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_220._0_8_ = &PTR__CommitParser_00b1da00;
  cmCTestVC::Revision::~Revision((Revision *)local_188);
  local_220._0_8_ = &PTR__DiffParser_00b1da60;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_p != &local_1a0) {
    operator_delete(local_1b0[0]._M_p,local_1a0._M_allocated_capacity + 1);
  }
  std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::~vector
            ((vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *)local_1e0)
  ;
  local_220._0_8_ = &PTR__LineParser_00b21468;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._24_8_ != &local_1f8) {
    operator_delete((void *)local_220._24_8_,local_1f8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_p != local_240) {
    operator_delete(local_250._M_p,local_240[0]._M_allocated_capacity + 1);
  }
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_268);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_298);
  if (local_310 != local_300) {
    operator_delete(local_310,local_300[0] + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  return true;
}

Assistant:

bool cmCTestGIT::LoadRevisions()
{
  // Use 'git rev-list ... | git diff-tree ...' to get revisions.
  std::string range = this->OldRevision + ".." + this->NewRevision;
  std::string git = this->CommandLineTool;
  std::vector<std::string> git_rev_list = { git, "rev-list", "--reverse",
                                            range, "--" };
  std::vector<std::string> git_diff_tree = {
    git,  "diff-tree", "--stdin",      "--always",
    "-z", "-r",        "--pretty=raw", "--encoding=utf-8"
  };
  this->Log << cmCTestGIT::ComputeCommandLine(git_rev_list) << " | "
            << cmCTestGIT::ComputeCommandLine(git_diff_tree) << "\n";

  cmUVProcessChainBuilder builder;
  builder.AddCommand(git_rev_list)
    .AddCommand(git_diff_tree)
    .SetWorkingDirectory(this->SourceDirectory);

  CommitParser out(this, "dt-out> ");
  OutputLogger err(this->Log, "dt-err> ");
  cmCTestGIT::RunProcess(builder, &out, &err, cmProcessOutput::UTF8);

  // Send one extra zero-byte to terminate the last record.
  out.Process("", 1);

  return true;
}